

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.cpp
# Opt level: O0

void add_value(MatchState *ms,luaL_Buffer *b,char *s,char *e,int tr)

{
  lua_State *L_00;
  int iVar1;
  char *pcVar2;
  int n;
  lua_State *L;
  int tr_local;
  char *e_local;
  char *s_local;
  luaL_Buffer *b_local;
  MatchState *ms_local;
  
  L_00 = ms->L;
  if (tr == 5) {
    push_onecapture(ms,0,s,e);
    lua_gettable(L_00,3);
  }
  else {
    if (tr != 6) {
      add_s(ms,b,s,e);
      return;
    }
    lua_pushvalue(L_00,3);
    iVar1 = push_captures(ms,s,e);
    lua_callk(L_00,iVar1,1,0,(lua_CFunction)0x0);
  }
  iVar1 = lua_toboolean(L_00,-1);
  if (iVar1 == 0) {
    lua_settop(L_00,-2);
    lua_pushlstring(L_00,s,(long)e - (long)s);
  }
  else {
    iVar1 = lua_isstring(L_00,-1);
    if (iVar1 == 0) {
      iVar1 = lua_type(L_00,-1);
      pcVar2 = lua_typename(L_00,iVar1);
      luaL_error(L_00,"invalid replacement value (a %s)",pcVar2);
    }
  }
  luaL_addvalue(b);
  return;
}

Assistant:

static void add_value (MatchState *ms, luaL_Buffer *b, const char *s,
                                       const char *e, int tr) {
  lua_State *L = ms->L;
  switch (tr) {
    case LUA_TFUNCTION: {
      int n;
      lua_pushvalue(L, 3);
      n = push_captures(ms, s, e);
      lua_call(L, n, 1);
      break;
    }
    case LUA_TTABLE: {
      push_onecapture(ms, 0, s, e);
      lua_gettable(L, 3);
      break;
    }
    default: {  /* LUA_TNUMBER or LUA_TSTRING */
      add_s(ms, b, s, e);
      return;
    }
  }
  if (!lua_toboolean(L, -1)) {  /* nil or false? */
    lua_pop(L, 1);
    lua_pushlstring(L, s, e - s);  /* keep original text */
  }
  else if (!lua_isstring(L, -1))
    luaL_error(L, "invalid replacement value (a %s)", luaL_typename(L, -1));
  luaL_addvalue(b);  /* add result to accumulator */
}